

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_handle.cpp
# Opt level: O1

void __thiscall
libtorrent::session_handle::apply_settings
          (session_handle *this,
          vector<libtorrent::torrent_handle,_std::allocator<libtorrent::torrent_handle>_> *s)

{
  _Sp_counted_ptr_inplace<libtorrent::settings_pack,_std::allocator<libtorrent::settings_pack>,_(__gnu_cxx::_Lock_policy)2>
  *p_Var1;
  shared_ptr<libtorrent::settings_pack> copy;
  undefined1 local_31;
  _Impl *local_30;
  _Sp_counted_ptr_inplace<libtorrent::settings_pack,_std::allocator<libtorrent::settings_pack>,_(__gnu_cxx::_Lock_policy)2>
  *local_28;
  
  local_30 = (_Impl *)0x0;
  p_Var1 = (_Sp_counted_ptr_inplace<libtorrent::settings_pack,_std::allocator<libtorrent::settings_pack>,_(__gnu_cxx::_Lock_policy)2>
            *)operator_new(0x60);
  ::std::
  _Sp_counted_ptr_inplace<libtorrent::settings_pack,_std::allocator<libtorrent::settings_pack>,_(__gnu_cxx::_Lock_policy)2>
  ::_Sp_counted_ptr_inplace<libtorrent::settings_pack>(p_Var1,&local_31,s);
  local_30 = &p_Var1->_M_impl;
  local_28 = p_Var1;
  async_call<void(libtorrent::aux::session_impl::*)(std::shared_ptr<libtorrent::settings_pack>),std::shared_ptr<libtorrent::settings_pack>&>
            (this,0x169,(shared_ptr<libtorrent::settings_pack> *)0x0);
  if (local_28 !=
      (_Sp_counted_ptr_inplace<libtorrent::settings_pack,_std::allocator<libtorrent::settings_pack>,_(__gnu_cxx::_Lock_policy)2>
       *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (&local_28->super__Sp_counted_base<(__gnu_cxx::_Lock_policy)2>);
  }
  return;
}

Assistant:

void session_handle::apply_settings(settings_pack&& s)
	{
		TORRENT_ASSERT_PRECOND(!s.has_val(settings_pack::out_enc_policy)
			|| s.get_int(settings_pack::out_enc_policy)
				<= settings_pack::pe_disabled);
		TORRENT_ASSERT_PRECOND(!s.has_val(settings_pack::in_enc_policy)
			|| s.get_int(settings_pack::in_enc_policy)
				<= settings_pack::pe_disabled);
		TORRENT_ASSERT_PRECOND(!s.has_val(settings_pack::allowed_enc_level)
			|| s.get_int(settings_pack::allowed_enc_level)
				<= settings_pack::pe_both);

		auto copy = std::make_shared<settings_pack>(std::move(s));
		async_call(&session_impl::apply_settings_pack, copy);
	}